

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_queued.c
# Opt level: O2

void libpd_queued_receive_pd_messages(void)

{
  void *pvVar1;
  int len;
  char *pcVar2;
  char *pcVar3;
  pd_params *p;
  
  pvVar1 = libpd_mainimp.i_queued;
  len = rb_available_to_read(*(ring_buffer **)((long)libpd_mainimp.i_queued + 0x70));
  if (len == 0) {
    return;
  }
  rb_read_from_buffer(*(ring_buffer **)((long)pvVar1 + 0x70),(char *)((long)pvVar1 + 0x80),len);
  pcVar3 = (char *)((long)pvVar1 + 0x80);
switchD_00199377_default:
  pcVar2 = pcVar3;
  if ((char *)((long)pvVar1 + (long)len + 0x80) <= pcVar2) {
    return;
  }
  pcVar3 = pcVar2 + 0x28;
  switch(*(undefined4 *)pcVar2) {
  case 0:
    if (*(code **)((long)libpd_mainimp.i_queued + 0x68) != (code *)0x0) {
      (**(code **)((long)libpd_mainimp.i_queued + 0x68))(pcVar3);
    }
    pcVar3 = pcVar3 + *(int *)(pcVar2 + 0x20);
    goto switchD_00199377_default;
  case 1:
    if (*libpd_mainimp.i_queued != (code *)0x0) {
      (**libpd_mainimp.i_queued)(*(undefined8 *)(pcVar2 + 8));
    }
    goto switchD_00199377_default;
  case 2:
    if (*(code **)((long)libpd_mainimp.i_queued + 8) == (code *)0x0) {
      if (*(code **)((long)libpd_mainimp.i_queued + 0x10) != (code *)0x0) {
        (**(code **)((long)libpd_mainimp.i_queued + 0x10))
                  ((double)*(float *)(pcVar2 + 0x10),*(undefined8 *)(pcVar2 + 8));
      }
    }
    else {
      (**(code **)((long)libpd_mainimp.i_queued + 8))
                (*(undefined4 *)(pcVar2 + 0x10),*(undefined8 *)(pcVar2 + 8));
    }
    goto switchD_00199377_default;
  case 3:
    if (*(code **)((long)libpd_mainimp.i_queued + 0x18) != (code *)0x0) {
      (**(code **)((long)libpd_mainimp.i_queued + 0x18))
                (*(undefined8 *)(pcVar2 + 8),*(undefined8 *)(pcVar2 + 0x18));
    }
    goto switchD_00199377_default;
  case 4:
    if (*(code **)((long)libpd_mainimp.i_queued + 0x20) != (code *)0x0) {
      (**(code **)((long)libpd_mainimp.i_queued + 0x20))
                (*(undefined8 *)(pcVar2 + 8),*(undefined4 *)(pcVar2 + 0x20),pcVar3);
    }
    break;
  case 5:
    if (*(code **)((long)libpd_mainimp.i_queued + 0x28) != (code *)0x0) {
      (**(code **)((long)libpd_mainimp.i_queued + 0x28))
                (*(undefined8 *)(pcVar2 + 8),*(undefined8 *)(pcVar2 + 0x18),
                 *(undefined4 *)(pcVar2 + 0x20),pcVar3);
    }
    break;
  default:
    goto switchD_00199377_default;
  }
  pcVar3 = pcVar3 + (long)*(int *)(pcVar2 + 0x20) * 0x10;
  goto switchD_00199377_default;
}

Assistant:

void libpd_queued_receive_pd_messages() {
  queued_stuff *queued = QUEUEDSTUFF;
  size_t available = rb_available_to_read(queued->pd_receive_buffer);
  if (!available) return;
  rb_read_from_buffer(queued->pd_receive_buffer, queued->temp_buffer, (int)available);
  char *end = queued->temp_buffer + available;
  char *buffer = queued->temp_buffer;
  while (buffer < end) {
    pd_params *p = (pd_params *)buffer;
    buffer += S_PD_PARAMS;
    switch (p->type) {
      case LIBPD_PRINT: {
        receive_print(p, &buffer);
        break;
      }
      case LIBPD_BANG: {
        receive_bang(p, &buffer);
        break;
      }
      case LIBPD_FLOAT: {
        receive_float(p, &buffer);
        break;
      }
      case LIBPD_SYMBOL: {
        receive_symbol(p, &buffer);
        break;
      }
      case LIBPD_LIST: {
        receive_list(p, &buffer);
        break;
      }
      case LIBPD_MESSAGE: {
        receive_message(p, &buffer);
        break;
      }
      default:
        break;
    }
  }
}